

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

int stbir_set_output_pixel_subrect(STBIR_RESIZE *resize,int subx,int suby,int subw,int subh)

{
  uint uVar1;
  
  resize->output_subx = subx;
  resize->output_suby = suby;
  resize->output_subw = subw;
  resize->output_subh = subh;
  resize->needs_rebuild = 1;
  uVar1 = 0;
  if ((0 < subx + subw && subx < resize->output_w) && (suby < resize->output_h)) {
    uVar1 = (uint)((subh != 0 && subw != 0) &&
                  (suby + subh != 0 && SCARRY4(suby,subh) == suby + subh < 0));
  }
  return uVar1;
}

Assistant:

STBIRDEF int stbir_set_output_pixel_subrect( STBIR_RESIZE * resize, int subx, int suby, int subw, int subh )          // sets input region (full region by default)
{
  resize->output_subx = subx;
  resize->output_suby = suby;
  resize->output_subw = subw;
  resize->output_subh = subh;
  resize->needs_rebuild = 1;

  // are we inbounds?
  if ( ( subx >= resize->output_w ) || ( ( subx + subw ) <= 0 ) || ( suby >= resize->output_h ) || ( ( suby + subh ) <= 0 ) || ( subw == 0 ) || ( subh == 0 ) )
    return 0;

  return 1;
}